

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGReader.cpp
# Opt level: O0

void CFGReader::markIndirect(CfgNode *node)

{
  Type TVar1;
  BlockData *this;
  BlockData *data;
  CfgNode *node_local;
  
  TVar1 = CfgNode::type(node);
  if (TVar1 != CFG_BLOCK) {
    __assert_fail("node->type() == CfgNode::CFG_BLOCK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGReader.cpp"
                  ,0x75,"static void CFGReader::markIndirect(CfgNode *)");
  }
  this = (BlockData *)CfgNode::data(node);
  if (this != (BlockData *)0x0) {
    CfgNode::BlockData::setIndirect(this,true);
    return;
  }
  __assert_fail("data != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGReader.cpp"
                ,0x78,"static void CFGReader::markIndirect(CfgNode *)");
}

Assistant:

void CFGReader::markIndirect(CfgNode* node) {
	assert(node->type() == CfgNode::CFG_BLOCK);
	CfgNode::BlockData* data =
		static_cast<CfgNode::BlockData*>(node->data());
	assert(data != 0);
	data->setIndirect(true);
}